

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::InitializeUpdateData<duckdb::string_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_16_2_67f50693_for_value aVar10;
  anon_union_16_2_67f50693_for_value local_40;
  
  uVar1 = update_info->N;
  if ((ulong)uVar1 != 0) {
    pdVar2 = update->data;
    puVar7 = (undefined8 *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
    uVar8 = 0;
    do {
      uVar9 = uVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)sel->sel_vector[uVar8];
      }
      psVar3 = update->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[uVar9];
      }
      uVar5 = *(undefined8 *)(pdVar2 + uVar9 * 0x10 + 8);
      *puVar7 = *(undefined8 *)(pdVar2 + uVar9 * 0x10);
      puVar7[1] = uVar5;
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 2;
    } while (uVar1 != uVar8);
  }
  pdVar2 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  if (base_info->N != 0) {
    puVar7 = (undefined8 *)((long)&base_info[1].column_index + (ulong)base_info->max * 4);
    uVar8 = 0;
    do {
      uVar1 = *(uint *)((long)&base_info[1].segment + uVar8 * 4);
      puVar4 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) ||
         ((puVar4[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
        lVar6 = (ulong)uVar1 * 0x10;
        local_40._0_8_ = *(undefined8 *)(pdVar2 + lVar6);
        local_40.pointer.ptr = (char *)*(undefined8 *)(pdVar2 + lVar6 + 8);
        if ((uint)local_40._0_8_ < 0xd) {
          aVar10.pointer.ptr = local_40.pointer.ptr;
          aVar10._0_8_ = local_40._0_8_;
        }
        else {
          aVar10.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringHeap::AddBlob(&base_info->segment->heap,(string_t *)&local_40.pointer);
        }
        puVar7[-1] = aVar10._0_8_;
        *puVar7 = aVar10.pointer.ptr;
      }
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 2;
    } while (uVar8 < base_info->N);
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}